

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

array_n<bool,_2,_std::allocator<bool>_> * __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::operator=
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  uint uVar1;
  bool *pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  long lVar5;
  array_n<bool,_2,_std::allocator<bool>_> local_28;
  
  array_n(&local_28,obj);
  for (lVar5 = 2; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar1 = this->_dims[lVar5 + -2];
    this->_dims[lVar5 + -2] = local_28._dims[lVar5 + -2];
    local_28._dims[lVar5 + -2] = uVar1;
  }
  pbVar3 = this->first;
  pbVar4 = this->last;
  this->first = local_28.first;
  this->last = local_28.last;
  pbVar2 = this->_array;
  this->_array = local_28._array;
  local_28._array = pbVar2;
  local_28.first = pbVar3;
  local_28.last = pbVar4;
  ~array_n(&local_28);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }